

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O0

Vec_Int_t * Kf_ManCreateFaninCounts(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vCounts;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Vec_IntAlloc(iVar1);
  local_24 = 0;
  while( true ) {
    bVar4 = false;
    if (local_24 < p->nObjs) {
      pGStack_20 = Gia_ManObj(p,local_24);
      bVar4 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjIsAnd(pGStack_20);
    if (iVar1 == 0) {
      Vec_IntPush(p_00,0);
    }
    else {
      pGVar3 = Gia_ObjFanin0(pGStack_20);
      iVar1 = Gia_ObjIsCi(pGVar3);
      pGVar3 = Gia_ObjFanin1(pGStack_20);
      iVar2 = Gia_ObjIsCi(pGVar3);
      Vec_IntPush(p_00,(2 - iVar1) - iVar2);
    }
    local_24 = local_24 + 1;
  }
  iVar1 = Vec_IntSize(p_00);
  iVar2 = Gia_ManObjNum(p);
  if (iVar1 == iVar2) {
    return p_00;
  }
  __assert_fail("Vec_IntSize(vCounts) == Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaKf.c"
                ,0x3ea,"Vec_Int_t *Kf_ManCreateFaninCounts(Gia_Man_t *)");
}

Assistant:

Vec_Int_t * Kf_ManCreateFaninCounts( Gia_Man_t * p )  
{
    Vec_Int_t * vCounts;
    Gia_Obj_t * pObj; int i;
    vCounts = Vec_IntAlloc( Gia_ManObjNum(p) );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            Vec_IntPush( vCounts, 2 - Gia_ObjIsCi(Gia_ObjFanin0(pObj)) - Gia_ObjIsCi(Gia_ObjFanin1(pObj)) );
        else
            Vec_IntPush( vCounts, 0 );
    }
    assert( Vec_IntSize(vCounts) == Gia_ManObjNum(p) );
    return vCounts;
}